

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_encoder.c
# Opt level: O0

lzma_ret lzma_raw_encoder(lzma_stream *strm,lzma_filter *options)

{
  lzma_ret ret_;
  lzma_ret ret__1;
  lzma_filter *options_local;
  lzma_stream *strm_local;
  
  strm_local._4_4_ = lzma_strm_init(strm);
  if (strm_local._4_4_ == LZMA_OK) {
    strm_local._4_4_ =
         lzma_raw_coder_init(&strm->internal->next,strm->allocator,options,encoder_find,true);
    if (strm_local._4_4_ == LZMA_OK) {
      strm->internal->supported_actions[0] = true;
      strm->internal->supported_actions[1] = true;
      strm->internal->supported_actions[3] = true;
      strm_local._4_4_ = LZMA_OK;
    }
    else {
      lzma_end(strm);
    }
  }
  return strm_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_raw_encoder(lzma_stream *strm, const lzma_filter *options)
{
	lzma_next_strm_init(lzma_raw_coder_init, strm, options,
			(lzma_filter_find)(&encoder_find), true);

	strm->internal->supported_actions[LZMA_RUN] = true;
	strm->internal->supported_actions[LZMA_SYNC_FLUSH] = true;
	strm->internal->supported_actions[LZMA_FINISH] = true;

	return LZMA_OK;
}